

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O2

double __thiscall MeCab::Param::get<double>(Param *this,char *key)

{
  const_iterator cVar1;
  ostream *poVar2;
  istream *piVar3;
  stringstream interpreter;
  double local_1c8;
  double local_1c0;
  string local_1b8 [32];
  undefined1 local_198 [392];
  
  std::__cxx11::string::string((string *)local_198,key,(allocator *)&local_1c0);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->conf_)._M_t,(key_type *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->conf_)._M_t._M_impl.super__Rb_tree_header) {
    local_1c8 = 0.0;
  }
  else {
    std::__cxx11::string::string(local_1b8,(string *)(cVar1._M_node + 2));
    std::__cxx11::stringstream::stringstream((stringstream *)local_198);
    poVar2 = std::operator<<((ostream *)(local_198 + 0x10),local_1b8);
    local_1c8 = 0.0;
    if (((byte)poVar2[*(long *)(*(long *)poVar2 + -0x18) + 0x20] & 5) == 0) {
      piVar3 = std::istream::_M_extract<double>((double *)local_198);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        piVar3 = std::ws<char,std::char_traits<char>>((istream *)local_198);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 2) != 0) {
          local_1c8 = local_1c0;
        }
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::__cxx11::string::~string(local_1b8);
  }
  return local_1c8;
}

Assistant:

T get(const char *key) const {
    std::map<std::string, std::string>::const_iterator it = conf_.find(key);
    if (it == conf_.end()) {
      scoped_ptr<T> r(new T());
      return *r;
    }
    return lexical_cast<T, std::string>(it->second);
  }